

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
TryGetFixedProperty<true,false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          PropertyRecord *propertyRecord,Var *pProperty,FixedPropertyKind propertyType,
          ScriptContext *requestContext)

{
  DynamicObject *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var aValue;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  if ((((*(undefined8 **)(this + 0x20) != (undefined8 *)0x0) &&
       (this_00 = (DynamicObject *)**(undefined8 **)(this + 0x20), this_00 != (DynamicObject *)0x0))
      && ((((((this_00->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
          super_JavascriptLibraryBase).scriptContext.ptr == requestContext)) &&
     ((local_40 = propertyRecord,
      bVar2 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        (*(BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                           **)(this + 0x18),&local_40,
                         (SimpleDictionaryPropertyDescriptor<unsigned_short> **)
                         &propertyRecord_local), bVar2 &&
      (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject & 4) != 0)))) {
    if (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x1000) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xc6b,"(!(descriptor->Attributes & 0x10))",
                                  "can\'t have fixed global let/const");
      if (!bVar2) goto LAB_00c7b75d;
      *puVar3 = 0;
    }
    if ((uint)local_40->pid < 0x10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xc6c,"(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                  "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
      if (!bVar2) {
LAB_00c7b75d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    aValue = DynamicObject::GetSlot
                       (this_00,(uint)*(ushort *)
                                       ((long)&(propertyRecord_local->super_FinalizableObject).
                                               super_IRecyclerVisitedObject.
                                               _vptr_IRecyclerVisitedObject + 2));
    if ((aValue != (Var)0x0) &&
       (((bVar2 = DynamicTypeHandler::IsFixedMethodProperty((DynamicTypeHandler *)this,propertyType)
         , bVar2 && (bVar2 = VarIs<Js::JavascriptFunction>(aValue), bVar2)) ||
        (bVar2 = DynamicTypeHandler::IsFixedDataProperty((DynamicTypeHandler *)this,propertyType),
        bVar2)))) {
      *pProperty = aValue;
      return true;
    }
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->isFixed)
                {
                    AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "can't have fixed global let/const");
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(descriptor->propertyIndex);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->usedAsFixed = true;
                        }
                        return true;
                    }
                }
            }
            else
            {
                // If we're unordered, we may have removed this descriptor from the map and replaced it with a descriptor for a
                // different property. When we do that, we change the type of the instance, but the old type (which may still be
                // in some inline cache) still points to the same type handler.
                AssertMsg(allowNonExistent || isUnordered, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }